

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

void wabt::WriteDoubleHex(char *buffer,size_t size,uint64_t bits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 *puVar6;
  char *pcVar7;
  byte *pbVar8;
  ulong uVar9;
  size_t __n;
  undefined1 local_48 [8];
  char buffer_1 [40];
  
  uVar3 = (uint)(bits >> 0x34) & 0x7ff;
  uVar2 = uVar3 - 0x3ff;
  if ((long)bits < 0) {
    puVar6 = (undefined4 *)(local_48 + 1);
    local_48[0] = 0x2d;
  }
  else {
    puVar6 = (undefined4 *)local_48;
  }
  uVar4 = bits & 0xfffffffffffff;
  if (uVar2 == 0x400) {
    pbVar8 = (byte *)((long)puVar6 + 3);
    if (uVar4 == 0) {
      *puVar6 = 0x666e69;
    }
    else {
      *puVar6 = 0x6e616e;
      if (uVar4 != 0x8000000000000) {
        pbVar8[0] = 0x3a;
        pbVar8[1] = 0x30;
        pbVar8[2] = 0x78;
        pbVar8[3] = 0;
        iVar1 = -0x10;
        for (; uVar4 >> 0x3c == 0; uVar4 = uVar4 << 4) {
          iVar1 = iVar1 + 1;
        }
        pbVar8 = (byte *)((long)puVar6 + 6);
        for (; iVar1 != 0; iVar1 = iVar1 + 1) {
          *pbVar8 = "0123456789abcdef"[uVar4 >> 0x3c];
          pbVar8 = pbVar8 + 1;
          uVar4 = uVar4 << 4;
        }
      }
    }
    goto LAB_00d9a179;
  }
  *(undefined2 *)puVar6 = 0x7830;
  *(byte *)((long)puVar6 + 2) = (uVar3 == 0 && uVar4 == 0) ^ 0x31;
  if (uVar4 == 0) {
    pcVar7 = (char *)((long)puVar6 + 3);
  }
  else {
    uVar5 = uVar4 << 0xc;
    if (uVar3 == 0) {
      uVar9 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x3f;
      uVar5 = uVar5 << ((char)uVar9 + 1U & 0x3f);
      if (uVar9 == 0x3f) {
        uVar5 = 0;
      }
      uVar2 = -(int)uVar9 - 0x3ff;
    }
    *(undefined1 *)((long)puVar6 + 3) = 0x2e;
    pcVar7 = (char *)(puVar6 + 1);
    for (; uVar5 != 0; uVar5 = uVar5 << 4) {
      *pcVar7 = "0123456789abcdef"[uVar5 >> 0x3c];
      pcVar7 = pcVar7 + 1;
    }
  }
  *pcVar7 = 'p';
  if (uVar3 == 0 && uVar4 == 0) {
    pcVar7[3] = '\0';
    pcVar7[1] = '+';
    pcVar7[2] = '0';
    pbVar8 = (byte *)(pcVar7 + 3);
    goto LAB_00d9a179;
  }
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  pcVar7[1] = (char)((int)uVar2 >> 0x1f) * -2 + '+';
  if (uVar3 < 1000) {
    pbVar8 = (byte *)(pcVar7 + 2);
    if (99 < uVar3) goto LAB_00d9a13b;
    if (9 < uVar3) goto LAB_00d9a153;
  }
  else {
    pcVar7[2] = '1';
    pbVar8 = (byte *)(pcVar7 + 3);
LAB_00d9a13b:
    *pbVar8 = (byte)(((ulong)uVar3 / 100) % 10) | 0x30;
    pbVar8 = pbVar8 + 1;
LAB_00d9a153:
    *pbVar8 = (byte)(((ulong)uVar3 / 10) % 10) | 0x30;
    pbVar8 = pbVar8 + 1;
  }
  *pbVar8 = (byte)((ulong)uVar3 % 10) | 0x30;
  pbVar8 = pbVar8 + 1;
LAB_00d9a179:
  uVar4 = (long)pbVar8 - (long)local_48;
  __n = size - 1;
  if (uVar4 < size) {
    __n = uVar4;
  }
  memcpy(buffer,local_48,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteDoubleHex(char* buffer, size_t size, uint64_t bits) {
  return FloatWriter<double>::WriteHex(buffer, size, bits);
}